

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSocket.cpp
# Opt level: O0

bool __thiscall net_uv::UDPSocket::bind6(UDPSocket *this,char *ip,uint32_t port)

{
  uv_udp_t *puVar1;
  undefined8 uVar2;
  int32_t errcode;
  string local_a0;
  uint local_7c;
  undefined1 local_78 [4];
  int32_t r;
  sockaddr_in6 bind_addr;
  allocator<char> local_49;
  string local_48;
  uint32_t local_24;
  char *pcStack_20;
  uint32_t port_local;
  char *ip_local;
  UDPSocket *this_local;
  
  if (this->m_udp == (uv_udp_t *)0x0) {
    local_24 = port;
    pcStack_20 = ip;
    ip_local = (char *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,ip,&local_49);
    Socket::setIp(&this->super_Socket,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    Socket::setPort(&this->super_Socket,local_24);
    Socket::setIsIPV6(&this->super_Socket,true);
    local_7c = uv_ip6_addr(pcStack_20,local_24,(sockaddr_in6 *)local_78);
    if (local_7c == 0) {
      puVar1 = (uv_udp_t *)malloc(0xd8);
      this->m_udp = puVar1;
      local_7c = uv_udp_init((this->super_Socket).m_loop,this->m_udp);
      this->m_udp->data = this;
      local_7c = uv_udp_bind(this->m_udp,(sockaddr *)local_78,4);
      if (local_7c == 0) {
        net_adjustBuffSize((uv_handle_t *)this->m_udp,0x10000,0x10000);
        local_7c = uv_udp_recv_start(this->m_udp,Socket::uv_on_alloc_buffer,uv_on_after_read);
        if (local_7c == 0) {
          this_local._7_1_ = true;
        }
        else {
          net_getUVError_abi_cxx11_(&local_a0,(net_uv *)(ulong)local_7c,errcode);
          uVar2 = std::__cxx11::string::c_str();
          net_uvLog(3,"uv_udp_recv_start error: %s",uVar2);
          std::__cxx11::string::~string((string *)&local_a0);
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool UDPSocket::bind6(const char* ip, uint32_t port)
{
	if (m_udp != NULL)
	{
		return false;
	}

	this->setIp(ip);
	this->setPort(port);
	this->setIsIPV6(true);

	struct sockaddr_in6 bind_addr;
	int32_t r = uv_ip6_addr(ip, port, &bind_addr);

	if (r != 0)
	{
		return false;
	}

	m_udp = (uv_udp_t*)fc_malloc(sizeof(uv_udp_t));
	r = uv_udp_init(m_loop, m_udp);
	CHECK_UV_ASSERT(r);
	m_udp->data = this;

	r = uv_udp_bind(m_udp, (const struct sockaddr*) &bind_addr, UV_UDP_REUSEADDR);

	if (r != 0)
	{
		return false;
	}
	net_adjustBuffSize((uv_handle_t*)m_udp, UDP_UV_SOCKET_RECV_BUF_LEN, UDP_UV_SOCKET_RECV_BUF_LEN);

	r = uv_udp_recv_start(m_udp, uv_on_alloc_buffer, uv_on_after_read);
	if (r != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "uv_udp_recv_start error: %s", net_getUVError(r).c_str());
		return false;
	}

	return true;
}